

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenarioCollection.h
# Opt level: O1

void __thiscall gurkenlaeufer::ScenarioCollection::~ScenarioCollection(ScenarioCollection *this)

{
  std::__cxx11::_List_base<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::
  _M_clear(&(this->_scenarios).
            super__List_base<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>);
  operator_delete(this);
  return;
}

Assistant:

void appendScenario(Scenario scenario)
    {
        if (scenario.tags.end() != std::find_if(scenario.tags.begin(), scenario.tags.end(), [](const Step& step) {
            if (detail::toLower(step.step) == "@ignore") {
                return true;
            }
            return false; })) {
            std::cout << "Ignore scenario " << scenario.description;
            return;
        }
        _scenarios.emplace_back(std::move(scenario));
    }